

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_address.cpp
# Opt level: O1

void __thiscall
Address_GetBitcoinAddressFormatList_Test::TestBody(Address_GetBitcoinAddressFormatList_Test *this)

{
  bool bVar1;
  char *message;
  AssertionResult gtest_ar;
  vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_> list;
  AssertHelper AStack_58;
  string local_50;
  internal local_30 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_28;
  vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_> local_20;
  
  cfd::core::GetBitcoinAddressFormatList();
  cfd::core::AddressFormatData::GetBech32Hrp_abi_cxx11_
            (&local_50,
             local_20.
             super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
             ._M_impl.super__Vector_impl_data._M_start);
  testing::internal::CmpHelperSTREQ
            (local_30,"\"bc\"","list[NetType::kMainnet].GetBech32Hrp().c_str()","bc",
             local_50._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  if (local_30[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_50);
    if (local_28.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      message = "";
    }
    else {
      message = ((local_28.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&AStack_58,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_address.cpp"
               ,0x26,message);
    testing::internal::AssertHelper::operator=(&AStack_58,(Message *)&local_50);
    testing::internal::AssertHelper::~AssertHelper(&AStack_58);
    if ((long *)local_50._M_dataplus._M_p != (long *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) && ((long *)local_50._M_dataplus._M_p != (long *)0x0)) {
        (**(code **)(*(long *)local_50._M_dataplus._M_p + 8))();
      }
      local_50._M_dataplus._M_p = (pointer)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_28,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  std::vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>::~vector
            (&local_20);
  return;
}

Assistant:

TEST(Address, GetBitcoinAddressFormatList) {
  std::vector<AddressFormatData> list = GetBitcoinAddressFormatList();
  EXPECT_STREQ("bc", list[NetType::kMainnet].GetBech32Hrp().c_str());
}